

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNNode<unsigned_char>::print(CATNNode<unsigned_char> *this,wostream *os,int from)

{
  size_type sVar1;
  pointer pNVar2;
  wostream *pwVar3;
  NFATransition<unsigned_char> *t;
  pointer pNVar4;
  
  sVar1 = (this->m_submachine).m_id._M_string_length;
  pwVar3 = std::operator<<(os,L"N");
  pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,from);
  pwVar3 = std::operator<<(pwVar3,L" [ label=\"");
  if (sVar1 == 0) {
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,from);
  }
  else {
    pwVar3 = std::operator<<(pwVar3,(wstring *)&(this->m_submachine).m_id);
  }
  pwVar3 = std::operator<<(pwVar3,L"\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pNVar2 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar4 = (this->m_transitions).
                super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar2; pNVar4 = pNVar4 + 1) {
    pwVar3 = std::operator<<(os,L"N");
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" -> N");
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,pNVar4->m_dest);
    std::operator<<(pwVar3,L" [ label=\"");
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)os,pNVar4->m_tag);
    pwVar3 = std::operator<<(pwVar3,L":[");
    pwVar3 = Centaurus::operator<<(pwVar3,&pNVar4->m_label);
    std::operator<<(pwVar3,L"]");
    pwVar3 = std::operator<<(os,L"\" ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  }
  return;
}

Assistant:

void print(std::wostream& os, int from) const
	{
		if (m_submachine)
		{
			os << L"N" << from << L" [ label=\"" << m_submachine << L"\" ];" << std::endl;
		}
		else
		{
			os << L"N" << from << L" [ label=\"" << from << L"\" ];" << std::endl;
		}

		for (const auto& t : m_transitions)
		{
			os << L"N" << from << L" -> N" << t.dest() << L" [ label=\"";
			os << t.tag() << L":[" << t.label() << L"]";
			os << L"\" ];" << std::endl;
		}
	}